

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathNodeToNumberInternal(xmlXPathParserContextPtr ctxt,xmlNodePtr node)

{
  xmlChar *val;
  double ret;
  xmlChar *strval;
  xmlNodePtr node_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)xmlXPathNAN;
  }
  else {
    val = xmlXPathCastNodeToString(node);
    if (val == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      ctxt_local = (xmlXPathParserContextPtr)xmlXPathNAN;
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)xmlXPathCastStringToNumber(val);
      (*xmlFree)(val);
    }
  }
  return (double)ctxt_local;
}

Assistant:

static double
xmlXPathNodeToNumberInternal(xmlXPathParserContextPtr ctxt, xmlNodePtr node) {
    xmlChar *strval;
    double ret;

    if (node == NULL)
	return(xmlXPathNAN);
    strval = xmlXPathCastNodeToString(node);
    if (strval == NULL) {
        xmlXPathPErrMemory(ctxt);
	return(xmlXPathNAN);
    }
    ret = xmlXPathCastStringToNumber(strval);
    xmlFree(strval);

    return(ret);
}